

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day25.cpp
# Opt level: O0

void day25(input_t input)

{
  undefined1 auVar1 [32];
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  size_type sVar14;
  reference pvVar15;
  reference pvVar16;
  undefined1 (*pauVar17) [32];
  long lVar18;
  long in_RSI;
  char *in_RDI;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  uint32_t idx;
  uint32_t base;
  uint32_t m;
  __m256i d;
  uint32_t j;
  __m256i v;
  uint32_t i;
  __m256i *p256;
  uint32_t *p32;
  DisjointSet S;
  uint32_t n_vectors;
  uint32_t n_points;
  uint8_t c;
  uint8_t n;
  vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> V;
  value_type *in_stack_fffffffffffffa80;
  vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>
  *in_stack_fffffffffffffa88;
  uint in_stack_fffffffffffffa98;
  uint in_stack_fffffffffffffa9c;
  size_type __new_size;
  undefined8 uStack_550;
  undefined1 local_560 [32];
  undefined8 uStack_548;
  size_type in_stack_fffffffffffffac0;
  vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>
  *in_stack_fffffffffffffac8;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  uint local_384;
  uint local_344;
  uint local_31c;
  ushort local_2f0;
  vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> local_2d0;
  char *local_2b8;
  long local_2b0;
  undefined4 local_2a8;
  uint local_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined4 local_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined4 local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  uint local_c8;
  uint local_c4;
  undefined1 local_c0 [32];
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [32];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  DisjointSet *this;
  
  local_2b8 = in_RDI;
  local_2b0 = in_RSI;
  std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::vector
            ((vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> *)
             0x14e104);
  std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::reserve
            (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  while (lVar18 = local_2b0 + -1, local_2b0 != 0) {
    local_2b0 = lVar18;
    if ((byte)(*local_2b8 - 0x30U) < 10) {
      std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::push_back
                (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    }
    local_2b8 = local_2b8 + 1;
  }
  local_2b0 = lVar18;
  sVar14 = std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::size
                     (&local_2d0);
  std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::size
            (&local_2d0);
  std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::resize
            ((vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> *)this,
             __new_size);
  std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::size
            (&local_2d0);
  anon_unknown.dwarf_a5436::DisjointSet::DisjointSet(this,local_560._6_2_);
  pvVar15 = std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::
            operator[](&local_2d0,0);
  pvVar16 = std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::
            operator[](&local_2d0,0);
  auVar20._24_8_ = auStack_110._8_8_;
  auVar20._16_8_ = auStack_110._0_8_;
  auVar20._8_8_ = local_120._8_8_;
  auVar20._0_8_ = local_120._0_8_;
  local_31c = 1;
LAB_0014e2c1:
  if ((uint)(sVar14 >> 2) <= local_31c) {
    local_120 = auVar20._0_16_;
    auStack_110 = auVar20._16_16_;
    printf("Day 25 Part 1: %u\n",(ulong)local_2f0);
    anon_unknown.dwarf_a5436::DisjointSet::~DisjointSet((DisjointSet *)0x14e866);
    std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::~vector
              ((vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> *)
               CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    return;
  }
  local_2a4 = *(uint *)(pvVar15 + (ulong)local_31c * 4);
  auVar20._0_16_ = vpinsrd_avx(ZEXT416(local_2a4),local_2a4,1);
  auVar20._0_16_ = vpinsrd_avx(auVar20._0_16_,local_2a4,2);
  auVar20._0_16_ = vpinsrd_avx(auVar20._0_16_,local_2a4,3);
  auVar20._16_16_ = vpinsrd_avx(ZEXT416(local_2a4),local_2a4,1);
  auVar20._16_16_ = vpinsrd_avx(auVar20._16_16_,local_2a4,2);
  auVar20._16_16_ = vpinsrd_avx(auVar20._16_16_,local_2a4,3);
  auVar19._0_16_ = ZEXT116(0) * auVar20._0_16_ + ZEXT116(1) * auVar20._16_16_;
  auVar19._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar20._0_16_;
  local_c0._16_8_ = auVar19._16_8_;
  uVar11 = local_c0._16_8_;
  local_c0._24_8_ = auVar19._24_8_;
  uVar12 = local_c0._24_8_;
  local_344 = 0;
  local_c0 = auVar19;
  local_a0 = local_2a4;
  local_9c = local_2a4;
  local_98 = local_2a4;
  local_94 = local_2a4;
  local_90 = local_2a4;
  local_8c = local_2a4;
  local_88 = local_2a4;
  local_84 = local_2a4;
  do {
    pauVar17 = (undefined1 (*) [32])(pvVar16 + (ulong)local_344 * 0x20);
    local_280 = *(undefined8 *)*pauVar17;
    uStack_278 = *(undefined8 *)(*pauVar17 + 8);
    uStack_270 = *(undefined8 *)(*pauVar17 + 0x10);
    uStack_268 = *(undefined8 *)(*pauVar17 + 0x18);
    auVar1._16_8_ = uVar11;
    auVar1._0_16_ = auVar19._0_16_;
    auVar1._24_8_ = uVar12;
    auVar20 = vpsubb_avx2(auVar1,*pauVar17);
    local_420 = auVar20._0_8_;
    uStack_418 = auVar20._8_8_;
    uStack_410 = auVar20._16_8_;
    uStack_408 = auVar20._24_8_;
    local_2a0 = local_420;
    uStack_298 = uStack_418;
    uStack_290 = uStack_410;
    uStack_288 = uStack_408;
    auVar20 = vpabsb_avx2(auVar20);
    local_440 = auVar20._0_8_;
    uStack_438 = auVar20._8_8_;
    uStack_430 = auVar20._16_8_;
    uStack_428 = auVar20._24_8_;
    local_160 = local_440;
    uStack_158 = uStack_438;
    uStack_150 = uStack_430;
    uStack_148 = uStack_428;
    local_164 = 0x10;
    auVar1 = vpslld_avx2(auVar20,ZEXT416(0x10));
    local_460 = auVar1._0_8_;
    uStack_458 = auVar1._8_8_;
    uStack_450 = auVar1._16_8_;
    uStack_448 = auVar1._24_8_;
    local_1e0 = local_440;
    uStack_1d8 = uStack_438;
    uStack_1d0 = uStack_430;
    uStack_1c8 = uStack_428;
    local_200 = local_460;
    uStack_1f8 = uStack_458;
    uStack_1f0 = uStack_450;
    uStack_1e8 = uStack_448;
    auVar20 = vpaddd_avx2(auVar20,auVar1);
    local_4a0 = auVar20._0_8_;
    uStack_498 = auVar20._8_8_;
    uStack_490 = auVar20._16_8_;
    uStack_488 = auVar20._24_8_;
    local_1a0 = local_4a0;
    uStack_198 = uStack_498;
    uStack_190 = uStack_490;
    uStack_188 = uStack_488;
    local_1a4 = 8;
    auVar1 = vpslld_avx2(auVar20,ZEXT416(8));
    local_4c0 = auVar1._0_8_;
    uStack_4b8 = auVar1._8_8_;
    uStack_4b0 = auVar1._16_8_;
    uStack_4a8 = auVar1._24_8_;
    local_220 = local_4a0;
    uStack_218 = uStack_498;
    uStack_210 = uStack_490;
    uStack_208 = uStack_488;
    local_240 = local_4c0;
    uStack_238 = uStack_4b8;
    uStack_230 = uStack_4b0;
    uStack_228 = uStack_4a8;
    auVar1 = vpaddd_avx2(auVar20,auVar1);
    local_500 = auVar1._0_8_;
    uStack_4f8 = auVar1._8_8_;
    uStack_4f0 = auVar1._16_8_;
    uStack_4e8 = auVar1._24_8_;
    local_2a8 = 0x4000000;
    local_34 = 0x4000000;
    local_38 = 0x4000000;
    local_3c = 0x4000000;
    local_40 = 0x4000000;
    local_44 = 0x4000000;
    local_48 = 0x4000000;
    local_4c = 0x4000000;
    local_50 = 0x4000000;
    auVar20._0_16_ = vpinsrd_avx(ZEXT416(0x4000000),0x4000000,1);
    auVar20._0_16_ = vpinsrd_avx(auVar20._0_16_,0x4000000,2);
    auVar20._16_16_ = vpinsrd_avx(auVar20._0_16_,0x4000000,3);
    auVar20._0_16_ = vpinsrd_avx(ZEXT416(0x4000000),0x4000000,1);
    auVar20._0_16_ = vpinsrd_avx(auVar20._0_16_,0x4000000,2);
    auVar20._0_16_ = vpinsrd_avx(auVar20._0_16_,0x4000000,3);
    auVar20._0_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar20._0_16_;
    auVar20._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar20._16_16_;
    local_80._16_8_ = auVar20._16_8_;
    local_80._24_8_ = auVar20._24_8_;
    local_140 = local_500;
    uStack_138 = uStack_4f8;
    uStack_130 = uStack_4f0;
    uStack_128 = uStack_4e8;
    auVar10._16_8_ = local_80._16_8_;
    auVar10._0_16_ = auVar20._0_16_;
    auVar10._24_8_ = local_80._24_8_;
    uVar9 = vpcmpgtd_avx512vl(auVar10,auVar1);
    auVar1 = vpmovm2d_avx512vl(uVar9);
    __new_size = auVar1._0_8_;
    this = auVar1._8_8_;
    uStack_550 = auVar1._16_8_;
    uStack_548 = auVar1._24_8_;
    uStack_f0 = uStack_550;
    uStack_e8 = uStack_548;
    uVar2 = (uint)(SUB321(auVar1 >> 7,0) & 1);
    uVar3 = (uint)(SUB321(auVar1 >> 0x27,0) & 1) << 4;
    uVar4 = (uint)(SUB321(auVar1 >> 0x47,0) & 1) << 8;
    uVar5 = (uint)(SUB321(auVar1 >> 0x67,0) & 1) << 0xc;
    uVar6 = (uint)(SUB321(auVar1 >> 0x87,0) & 1) << 0x10;
    uVar7 = (uint)(SUB321(auVar1 >> 0xa7,0) & 1) << 0x14;
    uVar8 = (uint)(SUB321(auVar1 >> 199,0) & 1) << 0x18;
    local_384 = (uint)(SUB321(auVar1 >> 0xe7,0) & 1) << 0x1c;
    in_stack_fffffffffffffa9c =
         uVar2 | (uint)(SUB321(auVar1 >> 0xf,0) & 1) << 1 |
         (uint)(SUB321(auVar1 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar1 >> 0x1f,0) & 1) << 3 |
         uVar3 | (uint)(SUB321(auVar1 >> 0x2f,0) & 1) << 5 |
         (uint)(SUB321(auVar1 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar1 >> 0x3f,0) & 1) << 7 |
         uVar4 | (uint)(SUB321(auVar1 >> 0x4f,0) & 1) << 9 |
         (uint)(SUB321(auVar1 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar1 >> 0x5f,0) & 1) << 0xb |
         uVar5 | (uint)(SUB321(auVar1 >> 0x6f,0) & 1) << 0xd |
         (uint)(SUB321(auVar1 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar1 >> 0x7f,0) << 0xf | uVar6
         | (uint)(SUB321(auVar1 >> 0x8f,0) & 1) << 0x11 |
         (uint)(SUB321(auVar1 >> 0x97,0) & 1) << 0x12 | (uint)(SUB321(auVar1 >> 0x9f,0) & 1) << 0x13
         | uVar7 | (uint)(SUB321(auVar1 >> 0xaf,0) & 1) << 0x15 |
         (uint)(SUB321(auVar1 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar1 >> 0xbf,0) << 0x17 |
         uVar8 | (uint)(SUB321(auVar1 >> 0xcf,0) & 1) << 0x19 |
         (uint)(SUB321(auVar1 >> 0xd7,0) & 1) << 0x1a | (uint)(SUB321(auVar1 >> 0xdf,0) & 1) << 0x1b
         | local_384 | (uint)(SUB321(auVar1 >> 0xef,0) & 1) << 0x1d |
         (uint)(SUB321(auVar1 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar1[0x1f] >> 7) << 0x1f;
    if (in_stack_fffffffffffffa9c != 0) {
      local_384 = uVar2 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8 | local_384;
      iVar13 = local_344 * 8;
      local_100 = __new_size;
      uStack_f8 = this;
      local_80 = auVar20;
      local_260 = auVar19._0_16_;
      auStack_250 = auVar19._16_16_;
      do {
        local_c8 = local_384;
        in_stack_fffffffffffffa98 = 0;
        for (uVar2 = local_384; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
          in_stack_fffffffffffffa98 = in_stack_fffffffffffffa98 + 1;
        }
        if (iVar13 + (in_stack_fffffffffffffa98 >> 2) == local_31c) {
          local_31c = local_31c + 1;
          goto LAB_0014e2c1;
        }
        local_120 = auVar20._0_16_;
        auStack_110 = auVar20._16_16_;
        anon_unknown.dwarf_a5436::DisjointSet::join
                  ((DisjointSet *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                   (uint16_t)((uint)iVar13 >> 0x10),(uint16_t)iVar13);
        local_c4 = local_384;
        local_384 = local_384 & local_384 - 1;
        auVar20._0_16_ = local_120;
        auVar20._16_16_ = auStack_110;
      } while (local_384 != 0);
    }
    local_344 = local_344 + 1;
  } while( true );
}

Assistant:

void day25(input_t input) {
	std::vector<int8_t, aligned_allocator<int8_t, alignof(__m256i)>> V;
	V.reserve(8192);

	for (uint8_t n = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			V.push_back(n ? -c : c);
			n = 0;
		} else if (*input.s == '-') {
			n = 1;
		}
	}

	uint32_t n_points = V.size() / 4;

	// Pad to nearest multiple of AVX2 vector size
	V.resize((V.size() + 31ULL) & ~31ULL);
	uint32_t n_vectors = V.size() / 32;

	DisjointSet S(n_points);

	auto p32  = (uint32_t *) &V[0];
	auto p256 = (__m256i  *) &V[0];

	// Pairwise measure distance between points
	for (uint32_t i = 1; i < n_points; i++) {
		__m256i v = _mm256_set1_epi32(p32[i]);

		// Compare this point against 8 points at a time
		for (uint32_t j = 0; ; j++) {
			// Absolute difference per coordinate
			__m256i d = _mm256_abs_epi8(_mm256_sub_epi8(v, p256[j]));
			// Horizontal sum of differences per point
			d = _mm256_add_epi32(d, _mm256_slli_epi32(d, 16));
			d = _mm256_add_epi32(d, _mm256_slli_epi32(d,  8));
			// Less than 4?
			d = _mm256_cmpgt_epi32(_mm256_set1_epi32(0x04000000), d);

			uint32_t m = _mm256_movemask_epi8(d);
			if (m) {
				m &= 0x11111111;
				uint32_t base = j * 8;
				do {
					uint32_t idx = base + _tzcnt_u32(m) / 4;
					if (idx == i) {
						goto next_point;
					}
					S.join(i, idx);
					m = _blsr_u32(m);
				} while (m);
			}
		}
next_point:;
	}
	printf("Day 25 Part 1: %u\n", S.trees);
}